

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_classes.cpp
# Opt level: O0

void test_classes(void)

{
  initializer_list<Dog_*> __l;
  bool bVar1;
  int iVar2;
  duk_idx_t dVar3;
  duk_context *ctx_00;
  Dog *pDVar4;
  size_type sVar5;
  reference ppDVar6;
  string *psVar7;
  ostream *this;
  uint local_118;
  allocator<Dog_*> local_113;
  undefined1 local_112;
  allocator<char> local_111;
  uint i;
  undefined1 local_ea;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c5;
  allocator<char> local_b1;
  string local_b0;
  Dog *local_90;
  Dog *local_88;
  Dog *local_80;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<Dog_*,_std::allocator<Dog_*>_> dogs;
  duk_context *ctx;
  
  ctx_00 = duk_create_heap((duk_alloc_function)0x0,(duk_realloc_function)0x0,(duk_free_function)0x0,
                           (void *)0x0,(duk_fatal_function)0x0);
  dukglue_register_constructor<Dog,std::__cxx11::string_const&>(ctx_00,"Dog");
  dukglue_register_method<Dog,std::__cxx11::string_const&>(ctx_00,0x129cd0,(char *)0x0);
  dukglue_register_method<Dog,void,std::__cxx11::string_const&>(ctx_00,0x129d40,(char *)0x0);
  dukglue_register_method<Dog,void,bool>(ctx_00,0x129ab0,(char *)0x0);
  dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Dog::getBarkCount;
  dukglue_register_method<Dog,int>(ctx_00,0x129e30,(char *)0x0);
  test_eval(ctx_00,"var test = new Dog(\'Gus\');");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"test.getName();","Gus");
  test_eval(ctx_00,"test.rename(\'Archie\');");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"test.getName();","Archie");
  dukglue_register_function<void,Dog*>(ctx_00,pokeWithStick,"pokeWithStick");
  test_eval(ctx_00,"pokeWithStick(test);");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"test.getBarkCount();",1);
  dukglue_register_constructor<Goat>(ctx_00,"Goat");
  dukglue_register_delete<Goat>(ctx_00);
  test_eval(ctx_00,"var goat = new Goat();");
  duk_pop(ctx_00);
  test_eval_expect_error(ctx_00,"pokeWithStick(goat);");
  test_eval(ctx_00,"goat.delete()");
  duk_pop(ctx_00);
  dukglue_register_function<Dog*>(ctx_00,visitPuppy,"visitPuppy");
  test_eval(ctx_00,"var puppy = visitPuppy();");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"puppy.getName()","Sammie");
  test_eval(ctx_00,"pokeWithStick(puppy);");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"puppy.getBarkCount()",1);
  pDVar4 = visitPuppy();
  iVar2 = Dog::getBarkCount(pDVar4);
  test_assert(iVar2 == 1);
  test_eval(ctx_00,"puppy.dynamicfield = 4;");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"puppy.dynamicfield",4);
  test_eval(ctx_00,"puppy = null; puppy = visitPuppy();");
  duk_pop(ctx_00);
  test_eval_expect(ctx_00,"puppy.dynamicfield",4);
  dukglue_register_delete<Dog>(ctx_00);
  test_eval(ctx_00,"var myPuppy = new Dog(\'Squirt\');");
  test_eval(ctx_00,"pokeWithStick(myPuppy);");
  test_eval(ctx_00,"myPuppy.delete();");
  duk_pop_3(ctx_00);
  test_eval_expect_error(ctx_00,"myPuppy.bark();");
  test_eval_expect_error(ctx_00,"pokeWithStick(myPuppy);");
  test_eval_expect_error(ctx_00,"myPuppy.delete();");
  test_eval(ctx_00,"test.delete()");
  duk_pop(ctx_00);
  pDVar4 = (Dog *)operator_new(0x28);
  local_c5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Gus",&local_b1);
  Dog::Dog(pDVar4,&local_b0);
  local_c5 = 0;
  local_90 = pDVar4;
  pDVar4 = (Dog *)operator_new(0x28);
  local_ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Sammy",&local_e9);
  Dog::Dog(pDVar4,&local_e8);
  local_ea = 0;
  local_88 = pDVar4;
  pDVar4 = (Dog *)operator_new(0x28);
  local_112 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"Zoey",&local_111);
  Dog::Dog(pDVar4,(string *)&i);
  local_112 = 0;
  local_78 = &local_90;
  local_70 = 3;
  local_80 = pDVar4;
  std::allocator<Dog_*>::allocator(&local_113);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<Dog_*,_std::allocator<Dog_*>_>::vector
            ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68,__l,&local_113);
  std::allocator<Dog_*>::~allocator(&local_113);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  dukglue_push<std::vector<Dog*,std::allocator<Dog*>>>
            (ctx_00,(vector<Dog_*,_std::allocator<Dog_*>_> *)local_68);
  std::vector<Dog_*,_std::allocator<Dog_*>_>::clear
            ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68);
  dukglue_read<std::vector<Dog*,std::allocator<Dog*>>>
            (ctx_00,-1,(vector<Dog_*,_std::allocator<Dog_*>_> *)local_68);
  duk_pop(ctx_00);
  sVar5 = std::vector<Dog_*,_std::allocator<Dog_*>_>::size
                    ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68);
  test_assert(sVar5 == 3);
  ppDVar6 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at
                      ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68,0);
  psVar7 = Dog::getName_abi_cxx11_(*ppDVar6);
  bVar1 = std::operator==(psVar7,"Gus");
  test_assert(bVar1);
  ppDVar6 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at
                      ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68,1);
  psVar7 = Dog::getName_abi_cxx11_(*ppDVar6);
  bVar1 = std::operator==(psVar7,"Sammy");
  test_assert(bVar1);
  ppDVar6 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at
                      ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68,2);
  psVar7 = Dog::getName_abi_cxx11_(*ppDVar6);
  bVar1 = std::operator==(psVar7,"Zoey");
  test_assert(bVar1);
  for (local_118 = 0; local_118 < 3; local_118 = local_118 + 1) {
    ppDVar6 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at
                        ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68,(ulong)local_118);
    pDVar4 = *ppDVar6;
    if (pDVar4 != (Dog *)0x0) {
      Dog::~Dog(pDVar4);
      operator_delete(pDVar4,0x28);
    }
  }
  std::vector<Dog_*,_std::allocator<Dog_*>_>::~vector
            ((vector<Dog_*,_std::allocator<Dog_*>_> *)local_68);
  dVar3 = duk_get_top(ctx_00);
  test_assert(dVar3 == 0);
  duk_destroy_heap(ctx_00);
  this = std::operator<<((ostream *)&std::cout,"Classes tested OK");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test_classes() {
	duk_context* ctx = duk_create_heap_default();

	// - dukglue_register_constructor with arguments
	// - dukglue_register_method (const and non-const)
	dukglue_register_constructor<Dog, const std::string&>(ctx, "Dog");
	dukglue_register_method(ctx, &Dog::getName, "getName");  // const method
	dukglue_register_method(ctx, &Dog::rename, "rename");
	dukglue_register_method(ctx, &Dog::bark, "bark");
	dukglue_register_method(ctx, &Dog::getBarkCount, "getBarkCount");

	// - test that script can actually call constructor + methods
	test_eval(ctx, "var test = new Dog('Gus');");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getName();", "Gus");
	test_eval(ctx, "test.rename('Archie');");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getName();", "Archie");

	// - test native objects as arguments to native functions
	dukglue_register_function(ctx, pokeWithStick, "pokeWithStick");
	test_eval(ctx, "pokeWithStick(test);");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getBarkCount();", 1);

	// - test type-safety when passing native types
	dukglue_register_constructor<Goat>(ctx, "Goat");
	dukglue_register_delete<Goat>(ctx);
	test_eval(ctx, "var goat = new Goat();");
	duk_pop(ctx);
	test_eval_expect_error(ctx, "pokeWithStick(goat);");
	test_eval(ctx, "goat.delete()");
	duk_pop(ctx);

	// - test that objects can be passed from C++ to script correctly
	dukglue_register_function(ctx, visitPuppy, "visitPuppy");
	test_eval(ctx, "var puppy = visitPuppy();");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.getName()", "Sammie");
	test_eval(ctx, "pokeWithStick(puppy);");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.getBarkCount()", 1);
	test_assert(visitPuppy()->getBarkCount() == 1);

	// - test that dynamic fields persist when passing the same native object twice
	test_eval(ctx, "puppy.dynamicfield = 4;");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.dynamicfield", 4);
	test_eval(ctx, "puppy = null; puppy = visitPuppy();");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.dynamicfield", 4);

	// - test that references are properly invalidated by obj.delete()
	dukglue_register_delete<Dog>(ctx);
	test_eval(ctx, "var myPuppy = new Dog('Squirt');");
	test_eval(ctx, "pokeWithStick(myPuppy);");
	test_eval(ctx, "myPuppy.delete();");
	duk_pop_3(ctx);
	test_eval_expect_error(ctx, "myPuppy.bark();");
	test_eval_expect_error(ctx, "pokeWithStick(myPuppy);");
	test_eval_expect_error(ctx, "myPuppy.delete();");
	test_eval(ctx, "test.delete()");
	duk_pop(ctx);

	// std::vector<Cls*>
	{
		std::vector<Dog*> dogs = { new Dog("Gus"), new Dog("Sammy"), new Dog("Zoey") };
		dukglue_push(ctx, dogs);

		dogs.clear();
		dukglue_read(ctx, -1, &dogs);
		duk_pop(ctx);

		test_assert(dogs.size() == 3);
		test_assert(dogs.at(0)->getName() == "Gus");
		test_assert(dogs.at(1)->getName() == "Sammy");
		test_assert(dogs.at(2)->getName() == "Zoey");

		for (unsigned int i = 0; i < 3; i++)
			delete dogs.at(i);
	}

	test_assert(duk_get_top(ctx) == 0);
	duk_destroy_heap(ctx);

	std::cout << "Classes tested OK" << std::endl;
}